

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256_32.c
# Opt level: O2

uint64_t exp_check(uint64_t *n,uint64_t *a,uint32_t bBits,uint64_t *b)

{
  ulong *puVar1;
  uint64_t uVar2;
  uint uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  int iVar6;
  undefined4 in_register_00000014;
  ulong uVar7;
  uint32_t i;
  long lVar8;
  uint64_t *puVar9;
  uint32_t i_1;
  ulong uVar10;
  uint32_t i_2;
  void *__s;
  long lStack_280;
  uint64_t local_278 [64];
  uint64_t *local_78;
  uint64_t *local_70;
  ulong local_68;
  void *local_60;
  uint64_t local_58;
  ulong local_50;
  undefined1 *local_48;
  uint64_t *local_40;
  ulong local_38;
  
  local_38 = CONCAT44(in_register_00000014,bBits);
  lStack_280 = 0x177ad1;
  local_78 = a;
  local_70 = b;
  memset(local_278,0,0x200);
  local_278[0] = 1;
  local_40 = n;
  local_58 = *n;
  local_50 = 0;
  for (lVar8 = 0; uVar10 = local_38, lVar8 != 0x40; lVar8 = lVar8 + 1) {
    uVar5 = local_278[lVar8];
    uVar2 = local_40[lVar8];
    lStack_280 = 0x177b08;
    uVar4 = FStar_UInt64_eq_mask(uVar5,uVar2);
    lStack_280 = 0x177b16;
    uVar5 = FStar_UInt64_gte_mask(uVar5,uVar2);
    local_50 = local_50 & uVar4 | ~(uVar5 | uVar4);
  }
  uVar3 = (uint)local_38;
  lStack_280 = 1;
  uVar7 = 1;
  if (uVar3 != 0) {
    uVar7 = (ulong)((uVar3 - 1 >> 6) + 1);
  }
  iVar6 = (int)uVar7;
  if (uVar3 < (uint)(iVar6 << 6)) {
    lVar8 = -(ulong)(iVar6 * 8 + 0xfU & 0xfffffff0);
    __s = (void *)((long)local_278 + lVar8);
    local_68 = uVar7;
    local_48 = (undefined1 *)local_278;
    *(undefined8 *)((long)local_278 + lVar8 + -8) = 0x177b7a;
    memset(__s,0,(ulong)(uint)(iVar6 << 3));
    *(undefined8 *)((long)local_278 + lVar8 + -8) = 1;
    local_60 = __s;
    puVar1 = (ulong *)((long)__s + (uVar10 >> 6 & 0x3ffffff) * 8);
    *puVar1 = *puVar1 | *(long *)((long)local_278 + lVar8 + -8) << ((byte)uVar10 & 0x3f);
    local_38 = 0;
    for (uVar10 = 0; puVar9 = (uint64_t *)local_48, local_68 != uVar10; uVar10 = uVar10 + 1) {
      uVar5 = local_70[uVar10];
      uVar2 = *(uint64_t *)((long)local_60 + uVar10 * 8);
      *(undefined8 *)((long)local_278 + lVar8 + -8) = 0x177bb8;
      uVar4 = FStar_UInt64_eq_mask(uVar5,uVar2);
      *(undefined8 *)((long)local_278 + lVar8 + -8) = 0x177bc6;
      uVar5 = FStar_UInt64_gte_mask(uVar5,uVar2);
      local_38 = local_38 & uVar4 | ~(uVar5 | uVar4);
    }
  }
  else {
    lStack_280 = 0xffffffffffffffff;
    local_38 = 0xffffffffffffffff;
    puVar9 = local_278;
  }
  uVar10 = 0;
  for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 1) {
    uVar5 = local_78[lVar8];
    uVar2 = local_40[lVar8];
    *(undefined8 *)((long)puVar9 + -8) = 0x177c13;
    uVar4 = FStar_UInt64_eq_mask(uVar5,uVar2);
    *(undefined8 *)((long)puVar9 + -8) = 0x177c21;
    uVar5 = FStar_UInt64_gte_mask(uVar5,uVar2);
    uVar10 = uVar10 & uVar4 | ~(uVar5 | uVar4);
  }
  return local_38 & local_50 & uVar10 & -(ulong)((uint)local_58 & 1);
}

Assistant:

static uint32_t exp_check(uint32_t *n, uint32_t *a, uint32_t bBits, uint32_t *b)
{
  uint32_t one[8U] = { 0U };
  memset(one, 0U, 8U * sizeof (uint32_t));
  one[0U] = 1U;
  uint32_t bit0 = n[0U] & 1U;
  uint32_t m0 = 0U - bit0;
  uint32_t acc0 = 0U;
  KRML_MAYBE_FOR8(i,
    0U,
    8U,
    1U,
    uint32_t beq = FStar_UInt32_eq_mask(one[i], n[i]);
    uint32_t blt = ~FStar_UInt32_gte_mask(one[i], n[i]);
    acc0 = (beq & acc0) | (~beq & ((blt & 0xFFFFFFFFU) | (~blt & 0U))););
  uint32_t m10 = acc0;
  uint32_t m00 = m0 & m10;
  uint32_t bLen;
  if (bBits == 0U)
  {
    bLen = 1U;
  }
  else
  {
    bLen = (bBits - 1U) / 32U + 1U;
  }
  uint32_t m1;
  if (bBits < 32U * bLen)
  {
    KRML_CHECK_SIZE(sizeof (uint32_t), bLen);
    uint32_t b2[bLen];
    memset(b2, 0U, bLen * sizeof (uint32_t));
    uint32_t i0 = bBits / 32U;
    uint32_t j = bBits % 32U;
    b2[i0] = b2[i0] | 1U << j;
    uint32_t acc = 0U;
    for (uint32_t i = 0U; i < bLen; i++)
    {
      uint32_t beq = FStar_UInt32_eq_mask(b[i], b2[i]);
      uint32_t blt = ~FStar_UInt32_gte_mask(b[i], b2[i]);
      acc = (beq & acc) | (~beq & ((blt & 0xFFFFFFFFU) | (~blt & 0U)));
    }
    uint32_t res = acc;
    m1 = res;
  }
  else
  {
    m1 = 0xFFFFFFFFU;
  }
  uint32_t acc = 0U;
  KRML_MAYBE_FOR8(i,
    0U,
    8U,
    1U,
    uint32_t beq = FStar_UInt32_eq_mask(a[i], n[i]);
    uint32_t blt = ~FStar_UInt32_gte_mask(a[i], n[i]);
    acc = (beq & acc) | (~beq & ((blt & 0xFFFFFFFFU) | (~blt & 0U))););
  uint32_t m2 = acc;
  uint32_t m = m1 & m2;
  return m00 & m;
}